

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HessenbergDecomposition.h
# Opt level: O2

HessenbergDecomposition<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> * __thiscall
Eigen::HessenbergDecomposition<Eigen::Matrix<double,-1,-1,0,-1,-1>>::
compute<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
          (HessenbergDecomposition<Eigen::Matrix<double,_1,_1,0,_1,_1>> *this,
          EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>_>
          *matrix)

{
  internal::
  call_assignment<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,_1,0,_1,_1>const>const>>
            ((Matrix<double,__1,__1,_0,__1,__1> *)this,
             (CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,__1,__1,_0,__1,__1>_>_>
              *)matrix);
  if (1 < *(long *)(matrix + 8)) {
    PlainObjectBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::resize
              ((PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)(this + 0x18),
               *(long *)(matrix + 8) + -1,1);
    HessenbergDecomposition<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>_>::_compute
              ((MatrixType *)this,(CoeffVectorType *)(this + 0x18),(VectorType *)(this + 0x28));
  }
  this[0x38] = (HessenbergDecomposition<Eigen::Matrix<double,_1,_1,0,_1,_1>>)0x1;
  return (HessenbergDecomposition<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *)this;
}

Assistant:

HessenbergDecomposition& compute(const EigenBase<InputType>& matrix)
    {
      m_matrix = matrix.derived();
      if(matrix.rows()<2)
      {
        m_isInitialized = true;
        return *this;
      }
      m_hCoeffs.resize(matrix.rows()-1,1);
      _compute(m_matrix, m_hCoeffs, m_temp);
      m_isInitialized = true;
      return *this;
    }